

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O0

void __thiscall hwnet::Poller::Enable(Poller *this,Ptr *channel,int flag)

{
  bool bVar1;
  element_type *peVar2;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false> local_50 [3];
  int local_34;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false> local_30;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  int flag_local;
  Ptr *channel_local;
  Poller *this_local;
  
  guard._M_device._4_4_ = flag;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mtx);
  peVar2 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)channel);
  local_34 = (*peVar2->_vptr_Channel[1])();
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
       ::find(&this->channels,&local_34);
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<hwnet::Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>_>
       ::end(&this->channels);
  bVar1 = std::__detail::operator==(&local_30,local_50);
  if (!bVar1) {
    Epoll::Enable(&this->poller_,channel,guard._M_device._4_4_);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void Poller::Enable(const Channel::Ptr &channel,int flag) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->channels.find(channel->Fd()) == this->channels.end()) {
		return;
	} else {
		poller_.Enable(channel,flag);
	}
}